

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O3

Vec_Int_t * Saig_ManRetimeInitState(Aig_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  uint *__ptr;
  int *pVars;
  Vec_Ptr_t *pVVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  uint uVar6;
  long lVar7;
  
  p_00 = Cnf_DeriveSimpleForRetiming(p);
  pVVar5 = (Vec_Int_t *)0x0;
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  if (s != (sat_solver *)0x0) {
    pVVar5 = (Vec_Int_t *)0x0;
    iVar1 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,1000000,0,0,0);
    if (iVar1 == 1) {
      uVar6 = p->nObjs[2];
      __ptr = (uint *)malloc(0x10);
      uVar2 = 0x10;
      if (0xe < uVar6 - 1) {
        uVar2 = uVar6;
      }
      __ptr[1] = 0;
      *__ptr = uVar2;
      uVar6 = 0;
      if (uVar2 == 0) {
        pVars = (int *)0x0;
      }
      else {
        pVars = (int *)malloc((long)(int)uVar2 << 2);
      }
      *(int **)(__ptr + 2) = pVars;
      pVVar3 = p->vCis;
      if (0 < pVVar3->nSize) {
        lVar7 = 0;
        do {
          iVar1 = p_00->pVarNums[*(int *)((long)pVVar3->pArray[lVar7] + 0x24)];
          uVar6 = __ptr[1];
          if (uVar6 == *__ptr) {
            if ((int)uVar6 < 0x10) {
              if (pVars == (int *)0x0) {
                pVars = (int *)malloc(0x40);
              }
              else {
                pVars = (int *)realloc(pVars,0x40);
              }
              *(int **)(__ptr + 2) = pVars;
              uVar2 = 0x10;
              if (pVars == (int *)0x0) {
LAB_00638d0e:
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
            }
            else {
              if (pVars == (int *)0x0) {
                pVars = (int *)malloc((ulong)uVar6 * 8);
              }
              else {
                pVars = (int *)realloc(pVars,(ulong)uVar6 * 8);
              }
              *(int **)(__ptr + 2) = pVars;
              if (pVars == (int *)0x0) goto LAB_00638d0e;
              uVar2 = uVar6 * 2;
            }
            *__ptr = uVar2;
          }
          __ptr[1] = uVar6 + 1;
          pVars[(int)uVar6] = iVar1;
          lVar7 = lVar7 + 1;
          pVVar3 = p->vCis;
        } while (lVar7 < pVVar3->nSize);
        uVar6 = __ptr[1];
      }
      piVar4 = Sat_SolverGetModel(s,pVars,uVar6);
      iVar1 = p->nObjs[2];
      pVVar5 = (Vec_Int_t *)malloc(0x10);
      pVVar5->nSize = iVar1;
      pVVar5->nCap = iVar1;
      pVVar5->pArray = piVar4;
      if (pVars != (int *)0x0) {
        free(pVars);
      }
      free(__ptr);
    }
    else if (iVar1 == 0) {
      __assert_fail("RetValue != l_Undef",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigRetMin.c"
                    ,0x43,"Vec_Int_t *Saig_ManRetimeInitState(Aig_Man_t *)");
    }
    sat_solver_delete(s);
  }
  Cnf_DataFree(p_00);
  return pVVar5;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Derives the initial state after backward retiming.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Saig_ManRetimeInitState( Aig_Man_t * p )
{
    int nConfLimit = 1000000;
    Vec_Int_t * vCiIds, * vInit = NULL;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    int i, RetValue, * pModel;
    // solve the SAT problem
    pCnf = Cnf_DeriveSimpleForRetiming( p );
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    if ( pSat == NULL )
    {
        Cnf_DataFree( pCnf );
        return NULL;
    }
    RetValue = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    assert( RetValue != l_Undef );
    // create counter-example
    if ( RetValue == l_True )
    {
        // accumulate SAT variables of the CIs
        vCiIds = Vec_IntAlloc( Aig_ManCiNum(p) );
        Aig_ManForEachCi( p, pObj, i )
            Vec_IntPush( vCiIds, pCnf->pVarNums[pObj->Id] );
        // create the model
        pModel = Sat_SolverGetModel( pSat, vCiIds->pArray, vCiIds->nSize );
        vInit = Vec_IntAllocArray( pModel, Aig_ManCiNum(p) );
        Vec_IntFree( vCiIds );
    }
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    return vInit;
}